

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void covscript_main(int args_size,char **args)

{
  compiler_type *this;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [11];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined *puVar28;
  bool bVar29;
  char cVar30;
  int iVar31;
  int iVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar33;
  ostream *poVar34;
  fatal_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  __sighandler_t p_Var35;
  uint uVar36;
  long lVar37;
  char *pcVar38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
  *it;
  undefined8 *puVar39;
  char *pcVar40;
  char **ppcVar41;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  context_t context;
  context_t context_1;
  string path;
  ofstream out;
  array arg;
  array arg_1;
  string local_4e0;
  raii_collector local_4c0;
  context_t local_4b0;
  element_type *local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  string local_490 [4];
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _union_1457 local_378;
  sigset_t local_370;
  ios_base local_280 [264];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  method_base **local_128;
  method_base **local_120;
  bool local_98;
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar31 = covscript_args(args_size,args);
  cs::get_import_path_abi_cxx11_();
  plVar33 = (long *)std::__cxx11::string::insert((ulong)local_178,0,'\x01');
  p_Var35 = (__sighandler_t)(plVar33 + 2);
  if ((__sighandler_t)*plVar33 == p_Var35) {
    local_370.__val[1] = *(ulong *)p_Var35;
    local_370.__val[2] = plVar33[3];
    local_378.sa_handler = (__sighandler_t)(local_370.__val + 1);
  }
  else {
    local_370.__val[1] = *(ulong *)p_Var35;
    local_378.sa_handler = (__sighandler_t)*plVar33;
  }
  local_370.__val[0] = plVar33[1];
  *plVar33 = (long)p_Var35;
  plVar33[1] = 0;
  *(undefined1 *)(plVar33 + 2) = 0;
  std::__cxx11::string::_M_append(cs::current_process + 0x58,(ulong)local_378);
  if (local_378.sa_handler != (__sighandler_t)(local_370.__val + 1)) {
    operator_delete(local_378.sa_handler,local_370.__val[1] + 1);
  }
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,
                    (ulong)((long)&(((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                                      *)local_168._0_8_)->_M_impl).super__Deque_impl_data._M_map + 1
                           ));
  }
  if (show_help_info == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage:\n",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    cs [options...] <FILE|STDIN> [arguments...]\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    cs [options...]\n",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Interpreter Options:",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    Option                Mnemonic   Function\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --compile-only         -c          Only compile\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --dump-ast             -d          Export abstract syntax tree\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --dependency           -r          Export module dependency\n",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --csym         <FILE>  -g <FILE>   Read cSYM from file\n",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Interpreter REPL Options:",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    Option                Mnemonic   Function\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --silent               -s          Close the command prompt\n",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --args <...>           -a <...>    Set the arguments\n",0x37
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Common Options:",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    Option                Mnemonic   Function\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --no-optimize          -o          Disable optimizer\n",0x37
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --help                 -h          Show help infomation\n",
               0x3a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --version              -v          Show version infomation\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --wait-before-exit     -w          Wait before process exit\n",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n",0x45);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n",0x48);
    pcVar38 = "  --import-path  <PATH>  -i <PATH>   Set the import path\n";
    lVar37 = 0x39;
  }
  else {
    if (show_version_info != true) {
      if ((args_size == iVar31) || (repl != false)) {
        if (silent == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Covariant Script Programming Language Interpreter REPL\nVersion: ",0x40);
          poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,*(char **)(cs::current_process + 8),
                               *(long *)(cs::current_process + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar34," [",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar34,"GCC/Clang",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar34," on ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar34,"Linux",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar34,
                     "]\nCopyright (C) 2017-2025 Michael Lee. All rights reserved.\nPlease visit <http://covscript.org.cn/> for more information."
                     ,0x79);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar34 + -0x18) + (char)poVar34);
          std::ostream::put((char)poVar34);
          std::ostream::flush();
        }
        cs_impl::any::make_constant<std::__cxx11::string,char_const(&)[11]>
                  ((any *)&local_378,(char (*) [11])"<REPL_ENV>");
        local_48 = (undefined1  [16])0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_88._16_16_ = (undefined1  [16])0x0;
        local_88._0_16_ = (undefined1  [16])0x0;
        std::deque<cs_impl::any,std::allocator<cs_impl::any>>::
        _M_range_initialize<cs_impl::any_const*>
                  ((deque<cs_impl::any,std::allocator<cs_impl::any>> *)local_88,&local_378,
                   &local_370);
        cs_impl::any::recycle((any *)&local_378);
        iVar32 = args_size - iVar31;
        if (iVar32 != 0 && iVar31 <= args_size) {
          ppcVar41 = args + iVar31;
          do {
            cs_impl::any::make_constant<std::__cxx11::string,char*&>((any *)&local_378,ppcVar41);
            std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                      ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_88,
                       (any *)&local_378);
            cs_impl::any::recycle((any *)&local_378);
            ppcVar41 = ppcVar41 + 1;
            iVar32 = iVar32 + -1;
          } while (iVar32 != 0);
        }
        cs::create_context((cs *)&local_4c0,(array *)local_88);
        if (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_4a0 = local_4c0.context.
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_498 = local_4c0.context.
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
        memset(&local_370,0,0x90);
        local_378.sa_handler = signal_handler;
        sigemptyset(&local_370);
        sigaction(2,(sigaction *)&local_378,(sigaction *)0x0);
        local_3b8 = (_Any_data)0x0;
        local_3a0 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:290:53)>
                    ::_M_invoke;
        local_3a8 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:290:53)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xa8),(function<bool_(void_*)> *)&local_3b8);
        if (local_3a8 != (code *)0x0) {
          (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
        }
        local_3d8 = (_Any_data)0x0;
        local_3c0 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:294:55)>
                    ::_M_invoke;
        local_3c8 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:294:55)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xd0),(function<bool_(void_*)> *)&local_3d8);
        if (local_3c8 != (code *)0x0) {
          (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
        }
        local_3f8 = (_Any_data)0x0;
        local_3e0 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:297:55)>
                    ::_M_invoke;
        local_3e8 = std::
                    _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:297:55)>
                    ::_M_manager;
        cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                  ((stack_type<std::function<bool(void*)>,std::allocator> *)
                   (cs::current_process + 0xd0),(function<bool_(void_*)> *)&local_3f8);
        if (local_3e8 != (code *)0x0) {
          (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
        }
        (((local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        disable_optimizer = no_optimize;
        local_4b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_4b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        if (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        cs::repl::repl((repl *)local_178,&local_4b0);
        if (local_4b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4b0.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::ofstream::ofstream(&local_378);
        local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
        local_4e0._M_string_length = 0;
        local_4e0.field_2._M_local_buf[0] = '\0';
        local_98 = (bool)(silent ^ 1);
        do {
          if (((byte)toupper[*(long *)(std::cin + -0x18)] & 5) != 0) {
            local_490[0]._M_dataplus._M_p = local_490[0]._M_dataplus._M_p & 0xffffffff00000000;
            cs::process_context::on_process_exit_default_handler(local_490);
          }
          if (silent == false) {
            local_490[0]._M_dataplus._M_p = (pointer)&local_490[0].field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)local_490,(char)((long)local_120 - (long)local_128 >> 2));
            poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_490[0]._M_dataplus._M_p,
                                 local_490[0]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar34,"> ",2);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490[0]._M_dataplus._M_p != &local_490[0].field_2) {
              operator_delete(local_490[0]._M_dataplus._M_p,
                              local_490[0].field_2._M_allocated_capacity + 1);
            }
          }
          cVar30 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '@');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&local_4e0,cVar30);
          puVar28 = cs::current_process;
          if ((*cs::current_process & 1) != 0) {
            LOCK();
            *cs::current_process = 0;
            UNLOCK();
            cs::event_type::touch((event_type *)(puVar28 + 0xd0),(void *)0x0);
          }
          cs::repl::exec((repl *)local_178,&local_4e0);
        } while( true );
      }
      std::__cxx11::string::string((string *)&local_378,args[iVar31],(allocator *)local_178);
      cs::process_path(local_490,(string *)&local_378);
      if (local_378.sa_handler != (__sighandler_t)(local_370.__val + 1)) {
        operator_delete(local_378.sa_handler,local_370.__val[1] + 1);
      }
      iVar32 = std::__cxx11::string::compare((char *)local_490);
      if (iVar32 != 0) {
        bVar29 = cs_impl::file_system::exist(local_490);
        if (((!bVar29) || (bVar29 = cs_impl::file_system::is_dir(local_490), bVar29)) ||
           (bVar29 = cs_impl::file_system::can_read(local_490), !bVar29)) {
          this_00 = (fatal_error *)__cxa_allocate_exception(0x28);
          local_378.sa_handler = (__sighandler_t)(local_370.__val + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,"invalid input file.","");
          cs::fatal_error::fatal_error(this_00,(string *)&local_378);
          __cxa_throw(this_00,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
        }
        cs::prepend_import_path(local_490,(process_context *)cs::current_process);
      }
      local_138 = (undefined1  [16])0x0;
      local_148 = (undefined1  [16])0x0;
      local_158 = (undefined1  [16])0x0;
      local_168 = (undefined1  [16])0x0;
      local_178 = (undefined1  [16])0x0;
      std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map
                ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_178,0);
      iVar32 = args_size - iVar31;
      if (iVar32 != 0 && iVar31 <= args_size) {
        ppcVar41 = args + iVar31;
        do {
          cs_impl::any::make_constant<std::__cxx11::string,char*&>((any *)&local_378,ppcVar41);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_178,
                     (any *)&local_378);
          cs_impl::any::recycle((any *)&local_378);
          ppcVar41 = ppcVar41 + 1;
          iVar32 = iVar32 + -1;
        } while (iVar32 != 0);
      }
      cs::create_context((cs *)&local_4e0,(array *)local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_4e0._M_string_length + 8) =
               *(_Atomic_word *)(local_4e0._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_4e0._M_string_length + 8) =
               *(_Atomic_word *)(local_4e0._M_string_length + 8) + 1;
        }
      }
      local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4e0._M_dataplus._M_p;
      local_4c0.context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._M_string_length;
      local_398._8_8_ = 0;
      local_380 = std::
                  _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:223:53)>
                  ::_M_invoke;
      local_388 = std::
                  _Function_handler<bool_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/interpreter.cpp:223:53)>
                  ::_M_manager;
      local_398._M_unused._M_object = &local_4e0;
      cs::stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
                ((stack_type<std::function<bool(void*)>,std::allocator> *)
                 (cs::current_process + 0xa8),(function<bool_(void_*)> *)&local_398);
      if (local_388 != (code *)0x0) {
        (*local_388)(&local_398,&local_398,__destroy_functor);
      }
      this = *(compiler_type **)local_4e0._M_dataplus._M_p;
      this->disable_optimizer = no_optimize;
      if (csym_path_abi_cxx11_._M_string_length != 0) {
        cs::compiler_type::import_csym(this,local_490,&csym_path_abi_cxx11_);
      }
      iVar31 = std::__cxx11::string::compare((char *)local_490);
      if (iVar31 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)(local_4e0._M_dataplus._M_p + 0x70),0,
                   *(char **)(local_4e0._M_dataplus._M_p + 0x78),0x1e3588);
        cs::instance_type::compile
                  (*(instance_type **)(local_4e0._M_dataplus._M_p + 0x10),(istream *)&std::cin);
      }
      else {
        cs::instance_type::compile(*(instance_type **)(local_4e0._M_dataplus._M_p + 0x10),local_490)
        ;
      }
      if (dump_ast == true) {
        if (log_path_abi_cxx11_._M_string_length == 0) {
          cs::instance_type::dump_ast
                    (*(instance_type **)(local_4e0._M_dataplus._M_p + 0x10),(ostream *)&std::cout);
        }
        else {
          std::ofstream::ofstream(&local_378,(string *)&log_path_abi_cxx11_,_S_out);
          cs::instance_type::dump_ast
                    (*(instance_type **)(local_4e0._M_dataplus._M_p + 0x10),(ostream *)&local_378);
          local_378.sa_handler = (__sighandler_t)_VTT;
          *(undefined8 *)((long)&local_378 + _VTT[-3]) = ___throw_bad_array_new_length;
          std::filebuf::~filebuf((filebuf *)&local_370);
          std::ios_base::~ios_base(local_280);
        }
      }
      if (dump_dependency == true) {
        if (log_path_abi_cxx11_._M_string_length == 0) {
          lVar37 = *(long *)local_4e0._M_dataplus._M_p;
          pcVar38 = *(char **)(lVar37 + 0x48);
          puVar39 = *(undefined8 **)(lVar37 + 0x50);
          cVar30 = *pcVar38;
          pcVar40 = pcVar38;
          while (cVar30 < -1) {
            iVar31 = -(uint)(CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                            CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
            iVar32 = -(uint)(CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                            CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
            iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                            CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))
                                    ));
            iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                            CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))
                                    ));
            in_XMM1_Ba = -(*pcVar40 < (char)iVar31);
            in_XMM1_Bb = -(pcVar40[1] < (char)((uint)iVar31 >> 8));
            in_XMM1_Bc = -(pcVar40[2] < (char)((uint)iVar31 >> 0x10));
            in_XMM1_Bd = -(pcVar40[3] < (char)((uint)iVar31 >> 0x18));
            in_XMM1_Be = -(pcVar40[4] < (char)iVar32);
            in_XMM1_Bf = -(pcVar40[5] < (char)((uint)iVar32 >> 8));
            in_XMM1_Bg = -(pcVar40[6] < (char)((uint)iVar32 >> 0x10));
            in_XMM1_Bh = -(pcVar40[7] < (char)((uint)iVar32 >> 0x18));
            in_XMM1_Bi = -(pcVar40[8] < (char)iVar10);
            in_XMM1_Bj = -(pcVar40[9] < (char)((uint)iVar10 >> 8));
            in_XMM1_Bk = -(pcVar40[10] < (char)((uint)iVar10 >> 0x10));
            in_XMM1_Bl = -(pcVar40[0xb] < (char)((uint)iVar10 >> 0x18));
            in_XMM1_Bm = -(pcVar40[0xc] < (char)iVar11);
            in_XMM1_Bn = -(pcVar40[0xd] < (char)((uint)iVar11 >> 8));
            in_XMM1_Bo = -(pcVar40[0xe] < (char)((uint)iVar11 >> 0x10));
            in_XMM1_Bp = -(pcVar40[0xf] < (char)((uint)iVar11 >> 0x18));
            auVar6[1] = in_XMM1_Bb;
            auVar6[0] = in_XMM1_Ba;
            auVar6[2] = in_XMM1_Bc;
            auVar6[3] = in_XMM1_Bd;
            auVar6[4] = in_XMM1_Be;
            auVar6[5] = in_XMM1_Bf;
            auVar6[6] = in_XMM1_Bg;
            auVar6[7] = in_XMM1_Bh;
            auVar6[8] = in_XMM1_Bi;
            auVar6[9] = in_XMM1_Bj;
            auVar6[10] = in_XMM1_Bk;
            auVar6[0xb] = in_XMM1_Bl;
            auVar6[0xc] = in_XMM1_Bm;
            auVar6[0xd] = in_XMM1_Bn;
            auVar6[0xe] = in_XMM1_Bo;
            auVar6[0xf] = in_XMM1_Bp;
            auVar7[1] = in_XMM1_Bb;
            auVar7[0] = in_XMM1_Ba;
            auVar7[2] = in_XMM1_Bc;
            auVar7[3] = in_XMM1_Bd;
            auVar7[4] = in_XMM1_Be;
            auVar7[5] = in_XMM1_Bf;
            auVar7[6] = in_XMM1_Bg;
            auVar7[7] = in_XMM1_Bh;
            auVar7[8] = in_XMM1_Bi;
            auVar7[9] = in_XMM1_Bj;
            auVar7[10] = in_XMM1_Bk;
            auVar7[0xb] = in_XMM1_Bl;
            auVar7[0xc] = in_XMM1_Bm;
            auVar7[0xd] = in_XMM1_Bn;
            auVar7[0xe] = in_XMM1_Bo;
            auVar7[0xf] = in_XMM1_Bp;
            auVar25[1] = in_XMM1_Bd;
            auVar25[0] = in_XMM1_Bc;
            auVar25[2] = in_XMM1_Be;
            auVar25[3] = in_XMM1_Bf;
            auVar25[4] = in_XMM1_Bg;
            auVar25[5] = in_XMM1_Bh;
            auVar25[6] = in_XMM1_Bi;
            auVar25[7] = in_XMM1_Bj;
            auVar25[8] = in_XMM1_Bk;
            auVar25[9] = in_XMM1_Bl;
            auVar25[10] = in_XMM1_Bm;
            auVar25[0xb] = in_XMM1_Bn;
            auVar25[0xc] = in_XMM1_Bo;
            auVar25[0xd] = in_XMM1_Bp;
            auVar21[1] = in_XMM1_Be;
            auVar21[0] = in_XMM1_Bd;
            auVar21[2] = in_XMM1_Bf;
            auVar21[3] = in_XMM1_Bg;
            auVar21[4] = in_XMM1_Bh;
            auVar21[5] = in_XMM1_Bi;
            auVar21[6] = in_XMM1_Bj;
            auVar21[7] = in_XMM1_Bk;
            auVar21[8] = in_XMM1_Bl;
            auVar21[9] = in_XMM1_Bm;
            auVar21[10] = in_XMM1_Bn;
            auVar21[0xb] = in_XMM1_Bo;
            auVar21[0xc] = in_XMM1_Bp;
            auVar17[1] = in_XMM1_Bf;
            auVar17[0] = in_XMM1_Be;
            auVar17[2] = in_XMM1_Bg;
            auVar17[3] = in_XMM1_Bh;
            auVar17[4] = in_XMM1_Bi;
            auVar17[5] = in_XMM1_Bj;
            auVar17[6] = in_XMM1_Bk;
            auVar17[7] = in_XMM1_Bl;
            auVar17[8] = in_XMM1_Bm;
            auVar17[9] = in_XMM1_Bn;
            auVar17[10] = in_XMM1_Bo;
            auVar17[0xb] = in_XMM1_Bp;
            auVar13[1] = in_XMM1_Bg;
            auVar13[0] = in_XMM1_Bf;
            auVar13[2] = in_XMM1_Bh;
            auVar13[3] = in_XMM1_Bi;
            auVar13[4] = in_XMM1_Bj;
            auVar13[5] = in_XMM1_Bk;
            auVar13[6] = in_XMM1_Bl;
            auVar13[7] = in_XMM1_Bm;
            auVar13[8] = in_XMM1_Bn;
            auVar13[9] = in_XMM1_Bo;
            auVar13[10] = in_XMM1_Bp;
            uVar36 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB141(auVar25 >> 7,0) & 1) << 2 |
                              (ushort)(SUB131(auVar21 >> 7,0) & 1) << 3 |
                              (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                              (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                       CONCAT18(in_XMM1_Bo,
                                                                CONCAT17(in_XMM1_Bn,
                                                                         CONCAT16(in_XMM1_Bm,
                                                                                  CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                       CONCAT17(in_XMM1_Bo,
                                                                CONCAT16(in_XMM1_Bn,
                                                                         CONCAT15(in_XMM1_Bm,
                                                                                  CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                             (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
            uVar1 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            puVar39 = (undefined8 *)((long)puVar39 + (ulong)(uVar1 * 0x30));
            cVar30 = pcVar40[uVar1];
            pcVar40 = pcVar40 + uVar1;
          }
          lVar37 = *(long *)(lVar37 + 0x60);
          while (pcVar40 != pcVar38 + lVar37) {
            poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)*puVar39,puVar39[1]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar34 + -0x18) + (char)poVar34);
            std::ostream::put((char)poVar34);
            std::ostream::flush();
            puVar39 = puVar39 + 6;
            cVar30 = pcVar40[1];
            pcVar40 = pcVar40 + 1;
            while (cVar30 < -1) {
              iVar31 = -(uint)(CONCAT13(in_XMM1_Bd,
                                        CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                              CONCAT13(in_XMM1_Bd,
                                       CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
              iVar32 = -(uint)(CONCAT13(in_XMM1_Bh,
                                        CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                              CONCAT13(in_XMM1_Bh,
                                       CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
              iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,
                                        CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                              CONCAT13(in_XMM1_Bl,
                                       CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
              iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,
                                        CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                              CONCAT13(in_XMM1_Bp,
                                       CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
              in_XMM1_Ba = -(*pcVar40 < (char)iVar31);
              in_XMM1_Bb = -(pcVar40[1] < (char)((uint)iVar31 >> 8));
              in_XMM1_Bc = -(pcVar40[2] < (char)((uint)iVar31 >> 0x10));
              in_XMM1_Bd = -(pcVar40[3] < (char)((uint)iVar31 >> 0x18));
              in_XMM1_Be = -(pcVar40[4] < (char)iVar32);
              in_XMM1_Bf = -(pcVar40[5] < (char)((uint)iVar32 >> 8));
              in_XMM1_Bg = -(pcVar40[6] < (char)((uint)iVar32 >> 0x10));
              in_XMM1_Bh = -(pcVar40[7] < (char)((uint)iVar32 >> 0x18));
              in_XMM1_Bi = -(pcVar40[8] < (char)iVar10);
              in_XMM1_Bj = -(pcVar40[9] < (char)((uint)iVar10 >> 8));
              in_XMM1_Bk = -(pcVar40[10] < (char)((uint)iVar10 >> 0x10));
              in_XMM1_Bl = -(pcVar40[0xb] < (char)((uint)iVar10 >> 0x18));
              in_XMM1_Bm = -(pcVar40[0xc] < (char)iVar11);
              in_XMM1_Bn = -(pcVar40[0xd] < (char)((uint)iVar11 >> 8));
              in_XMM1_Bo = -(pcVar40[0xe] < (char)((uint)iVar11 >> 0x10));
              in_XMM1_Bp = -(pcVar40[0xf] < (char)((uint)iVar11 >> 0x18));
              auVar8[1] = in_XMM1_Bb;
              auVar8[0] = in_XMM1_Ba;
              auVar8[2] = in_XMM1_Bc;
              auVar8[3] = in_XMM1_Bd;
              auVar8[4] = in_XMM1_Be;
              auVar8[5] = in_XMM1_Bf;
              auVar8[6] = in_XMM1_Bg;
              auVar8[7] = in_XMM1_Bh;
              auVar8[8] = in_XMM1_Bi;
              auVar8[9] = in_XMM1_Bj;
              auVar8[10] = in_XMM1_Bk;
              auVar8[0xb] = in_XMM1_Bl;
              auVar8[0xc] = in_XMM1_Bm;
              auVar8[0xd] = in_XMM1_Bn;
              auVar8[0xe] = in_XMM1_Bo;
              auVar8[0xf] = in_XMM1_Bp;
              auVar9[1] = in_XMM1_Bb;
              auVar9[0] = in_XMM1_Ba;
              auVar9[2] = in_XMM1_Bc;
              auVar9[3] = in_XMM1_Bd;
              auVar9[4] = in_XMM1_Be;
              auVar9[5] = in_XMM1_Bf;
              auVar9[6] = in_XMM1_Bg;
              auVar9[7] = in_XMM1_Bh;
              auVar9[8] = in_XMM1_Bi;
              auVar9[9] = in_XMM1_Bj;
              auVar9[10] = in_XMM1_Bk;
              auVar9[0xb] = in_XMM1_Bl;
              auVar9[0xc] = in_XMM1_Bm;
              auVar9[0xd] = in_XMM1_Bn;
              auVar9[0xe] = in_XMM1_Bo;
              auVar9[0xf] = in_XMM1_Bp;
              auVar27[1] = in_XMM1_Bd;
              auVar27[0] = in_XMM1_Bc;
              auVar27[2] = in_XMM1_Be;
              auVar27[3] = in_XMM1_Bf;
              auVar27[4] = in_XMM1_Bg;
              auVar27[5] = in_XMM1_Bh;
              auVar27[6] = in_XMM1_Bi;
              auVar27[7] = in_XMM1_Bj;
              auVar27[8] = in_XMM1_Bk;
              auVar27[9] = in_XMM1_Bl;
              auVar27[10] = in_XMM1_Bm;
              auVar27[0xb] = in_XMM1_Bn;
              auVar27[0xc] = in_XMM1_Bo;
              auVar27[0xd] = in_XMM1_Bp;
              auVar23[1] = in_XMM1_Be;
              auVar23[0] = in_XMM1_Bd;
              auVar23[2] = in_XMM1_Bf;
              auVar23[3] = in_XMM1_Bg;
              auVar23[4] = in_XMM1_Bh;
              auVar23[5] = in_XMM1_Bi;
              auVar23[6] = in_XMM1_Bj;
              auVar23[7] = in_XMM1_Bk;
              auVar23[8] = in_XMM1_Bl;
              auVar23[9] = in_XMM1_Bm;
              auVar23[10] = in_XMM1_Bn;
              auVar23[0xb] = in_XMM1_Bo;
              auVar23[0xc] = in_XMM1_Bp;
              auVar19[1] = in_XMM1_Bf;
              auVar19[0] = in_XMM1_Be;
              auVar19[2] = in_XMM1_Bg;
              auVar19[3] = in_XMM1_Bh;
              auVar19[4] = in_XMM1_Bi;
              auVar19[5] = in_XMM1_Bj;
              auVar19[6] = in_XMM1_Bk;
              auVar19[7] = in_XMM1_Bl;
              auVar19[8] = in_XMM1_Bm;
              auVar19[9] = in_XMM1_Bn;
              auVar19[10] = in_XMM1_Bo;
              auVar19[0xb] = in_XMM1_Bp;
              auVar15[1] = in_XMM1_Bg;
              auVar15[0] = in_XMM1_Bf;
              auVar15[2] = in_XMM1_Bh;
              auVar15[3] = in_XMM1_Bi;
              auVar15[4] = in_XMM1_Bj;
              auVar15[5] = in_XMM1_Bk;
              auVar15[6] = in_XMM1_Bl;
              auVar15[7] = in_XMM1_Bm;
              auVar15[8] = in_XMM1_Bn;
              auVar15[9] = in_XMM1_Bo;
              auVar15[10] = in_XMM1_Bp;
              uVar36 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB141(auVar27 >> 7,0) & 1) << 2 |
                                (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                                (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                                (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                                (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                         CONCAT18(in_XMM1_Bo,
                                                                  CONCAT17(in_XMM1_Bn,
                                                                           CONCAT16(in_XMM1_Bm,
                                                                                    CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                                (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                         CONCAT17(in_XMM1_Bo,
                                                                  CONCAT16(in_XMM1_Bn,
                                                                           CONCAT15(in_XMM1_Bm,
                                                                                    CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                               (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
              uVar1 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
                }
              }
              puVar39 = (undefined8 *)((long)puVar39 + (ulong)(uVar1 * 0x30));
              cVar30 = pcVar40[uVar1];
              pcVar40 = pcVar40 + uVar1;
            }
          }
        }
        else {
          std::ofstream::ofstream(&local_378,(string *)&log_path_abi_cxx11_,_S_out);
          lVar37 = *(long *)local_4e0._M_dataplus._M_p;
          pcVar38 = *(char **)(lVar37 + 0x48);
          puVar39 = *(undefined8 **)(lVar37 + 0x50);
          cVar30 = *pcVar38;
          pcVar40 = pcVar38;
          while (cVar30 < -1) {
            iVar31 = -(uint)(CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                            CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
            iVar32 = -(uint)(CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                            CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
            iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                            CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))
                                    ));
            iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                            CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))
                                    ));
            in_XMM1_Ba = -(*pcVar40 < (char)iVar31);
            in_XMM1_Bb = -(pcVar40[1] < (char)((uint)iVar31 >> 8));
            in_XMM1_Bc = -(pcVar40[2] < (char)((uint)iVar31 >> 0x10));
            in_XMM1_Bd = -(pcVar40[3] < (char)((uint)iVar31 >> 0x18));
            in_XMM1_Be = -(pcVar40[4] < (char)iVar32);
            in_XMM1_Bf = -(pcVar40[5] < (char)((uint)iVar32 >> 8));
            in_XMM1_Bg = -(pcVar40[6] < (char)((uint)iVar32 >> 0x10));
            in_XMM1_Bh = -(pcVar40[7] < (char)((uint)iVar32 >> 0x18));
            in_XMM1_Bi = -(pcVar40[8] < (char)iVar10);
            in_XMM1_Bj = -(pcVar40[9] < (char)((uint)iVar10 >> 8));
            in_XMM1_Bk = -(pcVar40[10] < (char)((uint)iVar10 >> 0x10));
            in_XMM1_Bl = -(pcVar40[0xb] < (char)((uint)iVar10 >> 0x18));
            in_XMM1_Bm = -(pcVar40[0xc] < (char)iVar11);
            in_XMM1_Bn = -(pcVar40[0xd] < (char)((uint)iVar11 >> 8));
            in_XMM1_Bo = -(pcVar40[0xe] < (char)((uint)iVar11 >> 0x10));
            in_XMM1_Bp = -(pcVar40[0xf] < (char)((uint)iVar11 >> 0x18));
            auVar2[1] = in_XMM1_Bb;
            auVar2[0] = in_XMM1_Ba;
            auVar2[2] = in_XMM1_Bc;
            auVar2[3] = in_XMM1_Bd;
            auVar2[4] = in_XMM1_Be;
            auVar2[5] = in_XMM1_Bf;
            auVar2[6] = in_XMM1_Bg;
            auVar2[7] = in_XMM1_Bh;
            auVar2[8] = in_XMM1_Bi;
            auVar2[9] = in_XMM1_Bj;
            auVar2[10] = in_XMM1_Bk;
            auVar2[0xb] = in_XMM1_Bl;
            auVar2[0xc] = in_XMM1_Bm;
            auVar2[0xd] = in_XMM1_Bn;
            auVar2[0xe] = in_XMM1_Bo;
            auVar2[0xf] = in_XMM1_Bp;
            auVar3[1] = in_XMM1_Bb;
            auVar3[0] = in_XMM1_Ba;
            auVar3[2] = in_XMM1_Bc;
            auVar3[3] = in_XMM1_Bd;
            auVar3[4] = in_XMM1_Be;
            auVar3[5] = in_XMM1_Bf;
            auVar3[6] = in_XMM1_Bg;
            auVar3[7] = in_XMM1_Bh;
            auVar3[8] = in_XMM1_Bi;
            auVar3[9] = in_XMM1_Bj;
            auVar3[10] = in_XMM1_Bk;
            auVar3[0xb] = in_XMM1_Bl;
            auVar3[0xc] = in_XMM1_Bm;
            auVar3[0xd] = in_XMM1_Bn;
            auVar3[0xe] = in_XMM1_Bo;
            auVar3[0xf] = in_XMM1_Bp;
            auVar24[1] = in_XMM1_Bd;
            auVar24[0] = in_XMM1_Bc;
            auVar24[2] = in_XMM1_Be;
            auVar24[3] = in_XMM1_Bf;
            auVar24[4] = in_XMM1_Bg;
            auVar24[5] = in_XMM1_Bh;
            auVar24[6] = in_XMM1_Bi;
            auVar24[7] = in_XMM1_Bj;
            auVar24[8] = in_XMM1_Bk;
            auVar24[9] = in_XMM1_Bl;
            auVar24[10] = in_XMM1_Bm;
            auVar24[0xb] = in_XMM1_Bn;
            auVar24[0xc] = in_XMM1_Bo;
            auVar24[0xd] = in_XMM1_Bp;
            auVar20[1] = in_XMM1_Be;
            auVar20[0] = in_XMM1_Bd;
            auVar20[2] = in_XMM1_Bf;
            auVar20[3] = in_XMM1_Bg;
            auVar20[4] = in_XMM1_Bh;
            auVar20[5] = in_XMM1_Bi;
            auVar20[6] = in_XMM1_Bj;
            auVar20[7] = in_XMM1_Bk;
            auVar20[8] = in_XMM1_Bl;
            auVar20[9] = in_XMM1_Bm;
            auVar20[10] = in_XMM1_Bn;
            auVar20[0xb] = in_XMM1_Bo;
            auVar20[0xc] = in_XMM1_Bp;
            auVar16[1] = in_XMM1_Bf;
            auVar16[0] = in_XMM1_Be;
            auVar16[2] = in_XMM1_Bg;
            auVar16[3] = in_XMM1_Bh;
            auVar16[4] = in_XMM1_Bi;
            auVar16[5] = in_XMM1_Bj;
            auVar16[6] = in_XMM1_Bk;
            auVar16[7] = in_XMM1_Bl;
            auVar16[8] = in_XMM1_Bm;
            auVar16[9] = in_XMM1_Bn;
            auVar16[10] = in_XMM1_Bo;
            auVar16[0xb] = in_XMM1_Bp;
            auVar12[1] = in_XMM1_Bg;
            auVar12[0] = in_XMM1_Bf;
            auVar12[2] = in_XMM1_Bh;
            auVar12[3] = in_XMM1_Bi;
            auVar12[4] = in_XMM1_Bj;
            auVar12[5] = in_XMM1_Bk;
            auVar12[6] = in_XMM1_Bl;
            auVar12[7] = in_XMM1_Bm;
            auVar12[8] = in_XMM1_Bn;
            auVar12[9] = in_XMM1_Bo;
            auVar12[10] = in_XMM1_Bp;
            uVar36 = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB141(auVar24 >> 7,0) & 1) << 2 |
                              (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                              (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                              (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                       CONCAT18(in_XMM1_Bo,
                                                                CONCAT17(in_XMM1_Bn,
                                                                         CONCAT16(in_XMM1_Bm,
                                                                                  CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                       CONCAT17(in_XMM1_Bo,
                                                                CONCAT16(in_XMM1_Bn,
                                                                         CONCAT15(in_XMM1_Bm,
                                                                                  CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                             (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
            uVar1 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            puVar39 = (undefined8 *)((long)puVar39 + (ulong)(uVar1 * 0x30));
            cVar30 = pcVar40[uVar1];
            pcVar40 = pcVar40 + uVar1;
          }
          lVar37 = *(long *)(lVar37 + 0x60);
          if (pcVar40 != pcVar38 + lVar37) {
            do {
              poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_378,(char *)*puVar39,puVar39[1]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar34 + -0x18) + (char)poVar34);
              std::ostream::put((char)poVar34);
              std::ostream::flush();
              puVar39 = puVar39 + 6;
              cVar30 = pcVar40[1];
              pcVar40 = pcVar40 + 1;
              while (cVar30 < -1) {
                iVar31 = -(uint)(CONCAT13(in_XMM1_Bd,
                                          CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                                CONCAT13(in_XMM1_Bd,
                                         CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
                iVar32 = -(uint)(CONCAT13(in_XMM1_Bh,
                                          CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                                CONCAT13(in_XMM1_Bh,
                                         CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
                iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,
                                          CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                                CONCAT13(in_XMM1_Bl,
                                         CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
                iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,
                                          CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                                CONCAT13(in_XMM1_Bp,
                                         CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
                in_XMM1_Ba = -(*pcVar40 < (char)iVar31);
                in_XMM1_Bb = -(pcVar40[1] < (char)((uint)iVar31 >> 8));
                in_XMM1_Bc = -(pcVar40[2] < (char)((uint)iVar31 >> 0x10));
                in_XMM1_Bd = -(pcVar40[3] < (char)((uint)iVar31 >> 0x18));
                in_XMM1_Be = -(pcVar40[4] < (char)iVar32);
                in_XMM1_Bf = -(pcVar40[5] < (char)((uint)iVar32 >> 8));
                in_XMM1_Bg = -(pcVar40[6] < (char)((uint)iVar32 >> 0x10));
                in_XMM1_Bh = -(pcVar40[7] < (char)((uint)iVar32 >> 0x18));
                in_XMM1_Bi = -(pcVar40[8] < (char)iVar10);
                in_XMM1_Bj = -(pcVar40[9] < (char)((uint)iVar10 >> 8));
                in_XMM1_Bk = -(pcVar40[10] < (char)((uint)iVar10 >> 0x10));
                in_XMM1_Bl = -(pcVar40[0xb] < (char)((uint)iVar10 >> 0x18));
                in_XMM1_Bm = -(pcVar40[0xc] < (char)iVar11);
                in_XMM1_Bn = -(pcVar40[0xd] < (char)((uint)iVar11 >> 8));
                in_XMM1_Bo = -(pcVar40[0xe] < (char)((uint)iVar11 >> 0x10));
                in_XMM1_Bp = -(pcVar40[0xf] < (char)((uint)iVar11 >> 0x18));
                auVar4[1] = in_XMM1_Bb;
                auVar4[0] = in_XMM1_Ba;
                auVar4[2] = in_XMM1_Bc;
                auVar4[3] = in_XMM1_Bd;
                auVar4[4] = in_XMM1_Be;
                auVar4[5] = in_XMM1_Bf;
                auVar4[6] = in_XMM1_Bg;
                auVar4[7] = in_XMM1_Bh;
                auVar4[8] = in_XMM1_Bi;
                auVar4[9] = in_XMM1_Bj;
                auVar4[10] = in_XMM1_Bk;
                auVar4[0xb] = in_XMM1_Bl;
                auVar4[0xc] = in_XMM1_Bm;
                auVar4[0xd] = in_XMM1_Bn;
                auVar4[0xe] = in_XMM1_Bo;
                auVar4[0xf] = in_XMM1_Bp;
                auVar5[1] = in_XMM1_Bb;
                auVar5[0] = in_XMM1_Ba;
                auVar5[2] = in_XMM1_Bc;
                auVar5[3] = in_XMM1_Bd;
                auVar5[4] = in_XMM1_Be;
                auVar5[5] = in_XMM1_Bf;
                auVar5[6] = in_XMM1_Bg;
                auVar5[7] = in_XMM1_Bh;
                auVar5[8] = in_XMM1_Bi;
                auVar5[9] = in_XMM1_Bj;
                auVar5[10] = in_XMM1_Bk;
                auVar5[0xb] = in_XMM1_Bl;
                auVar5[0xc] = in_XMM1_Bm;
                auVar5[0xd] = in_XMM1_Bn;
                auVar5[0xe] = in_XMM1_Bo;
                auVar5[0xf] = in_XMM1_Bp;
                auVar26[1] = in_XMM1_Bd;
                auVar26[0] = in_XMM1_Bc;
                auVar26[2] = in_XMM1_Be;
                auVar26[3] = in_XMM1_Bf;
                auVar26[4] = in_XMM1_Bg;
                auVar26[5] = in_XMM1_Bh;
                auVar26[6] = in_XMM1_Bi;
                auVar26[7] = in_XMM1_Bj;
                auVar26[8] = in_XMM1_Bk;
                auVar26[9] = in_XMM1_Bl;
                auVar26[10] = in_XMM1_Bm;
                auVar26[0xb] = in_XMM1_Bn;
                auVar26[0xc] = in_XMM1_Bo;
                auVar26[0xd] = in_XMM1_Bp;
                auVar22[1] = in_XMM1_Be;
                auVar22[0] = in_XMM1_Bd;
                auVar22[2] = in_XMM1_Bf;
                auVar22[3] = in_XMM1_Bg;
                auVar22[4] = in_XMM1_Bh;
                auVar22[5] = in_XMM1_Bi;
                auVar22[6] = in_XMM1_Bj;
                auVar22[7] = in_XMM1_Bk;
                auVar22[8] = in_XMM1_Bl;
                auVar22[9] = in_XMM1_Bm;
                auVar22[10] = in_XMM1_Bn;
                auVar22[0xb] = in_XMM1_Bo;
                auVar22[0xc] = in_XMM1_Bp;
                auVar18[1] = in_XMM1_Bf;
                auVar18[0] = in_XMM1_Be;
                auVar18[2] = in_XMM1_Bg;
                auVar18[3] = in_XMM1_Bh;
                auVar18[4] = in_XMM1_Bi;
                auVar18[5] = in_XMM1_Bj;
                auVar18[6] = in_XMM1_Bk;
                auVar18[7] = in_XMM1_Bl;
                auVar18[8] = in_XMM1_Bm;
                auVar18[9] = in_XMM1_Bn;
                auVar18[10] = in_XMM1_Bo;
                auVar18[0xb] = in_XMM1_Bp;
                auVar14[1] = in_XMM1_Bg;
                auVar14[0] = in_XMM1_Bf;
                auVar14[2] = in_XMM1_Bh;
                auVar14[3] = in_XMM1_Bi;
                auVar14[4] = in_XMM1_Bj;
                auVar14[5] = in_XMM1_Bk;
                auVar14[6] = in_XMM1_Bl;
                auVar14[7] = in_XMM1_Bm;
                auVar14[8] = in_XMM1_Bn;
                auVar14[9] = in_XMM1_Bo;
                auVar14[10] = in_XMM1_Bp;
                uVar36 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB141(auVar26 >> 7,0) & 1) << 2 |
                                  (ushort)(SUB131(auVar22 >> 7,0) & 1) << 3 |
                                  (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                                  (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                                  (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                           CONCAT18(in_XMM1_Bo,
                                                                    CONCAT17(in_XMM1_Bn,
                                                                             CONCAT16(in_XMM1_Bm,
                                                                                      CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                                  (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                           CONCAT17(in_XMM1_Bo,
                                                                    CONCAT16(in_XMM1_Bn,
                                                                             CONCAT15(in_XMM1_Bm,
                                                                                      CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                                 (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
                uVar1 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
                  }
                }
                puVar39 = (undefined8 *)((long)puVar39 + (ulong)(uVar1 * 0x30));
                cVar30 = pcVar40[uVar1];
                pcVar40 = pcVar40 + uVar1;
              }
            } while (pcVar40 != pcVar38 + lVar37);
          }
          local_378.sa_handler = (__sighandler_t)_VTT;
          *(undefined8 *)((long)&local_378 + _VTT[-3]) = ___throw_bad_array_new_length;
          std::filebuf::~filebuf((filebuf *)&local_370);
          std::ios_base::~ios_base(local_280);
        }
      }
      if (compile_only == false) {
        cs::instance_type::interpret(*(instance_type **)(local_4e0._M_dataplus._M_p + 0x10));
      }
      cs::raii_collector::~raii_collector(&local_4c0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._M_string_length);
      }
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490[0]._M_dataplus._M_p == &local_490[0].field_2) {
        return;
      }
      operator_delete(local_490[0]._M_dataplus._M_p,local_490[0].field_2._M_allocated_capacity + 1);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version: ",9);
    poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(cs::current_process + 8),
                         *(long *)(cs::current_process + 0x10));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar34 + -0x18) + (char)poVar34);
    std::ostream::put((char)poVar34);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Licensed under the Apache License, Version 2.0 (the \"License\");\nyou may not use this file except in compliance with the License.\nYou may obtain a copy of the License at\n\nhttp://www.apache.org/licenses/LICENSE-2.0\n\nUnless required by applicable law or agreed to in writing, software\ndistributed under the License is distributed on an \"AS IS\" BASIS,\nWITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\nSee the License for the specific language governing permissions and\nlimitations under the License.\n\nCopyright (C) 2017-2025 Michael Lee\n\nThis software is registered with the National Copyright Administration\nof the People\'s Republic of China(Registration Number: 2020SR0408026)\nand is protected by the Copyright Law of the People\'s Republic of China.\n\nPlease visit http://covscript.org.cn for more information."
               ,0x33f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nMetadata:\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Import Path: ",0xf);
    poVar34 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(cs::current_process + 0x58),
                         *(long *)(cs::current_process + 0x60));
    std::__ostream_insert<char,std::char_traits<char>>(poVar34,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  STD Version: ",0xf);
    cs_impl::any::any<cs::numeric>((any *)&local_378,(numeric *)(cs::current_process + 0x30));
    poVar34 = operator<<((ostream *)&std::cout,(any *)&local_378);
    std::__ostream_insert<char,std::char_traits<char>>(poVar34,"\n",1);
    cs_impl::any::recycle((any *)&local_378);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  API Version: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"230801",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ABI Version: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"230308",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Runtime Env: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Linux",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Compile Env: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GCC/Clang",9);
    lVar37 = 1;
    pcVar38 = "\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar38,lVar37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void covscript_main(int args_size, char *args[])
{
	int index = covscript_args(args_size, args);
	cs::current_process->import_path += cs::path_delimiter + cs::get_import_path();
	if (show_help_info) {
		std::cout << "Usage:\n";
		std::cout << "    cs [options...] <FILE|STDIN> [arguments...]\n";
		std::cout << "    cs [options...]\n";
		std::cout << std::endl;
		std::cout << "Interpreter Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --compile-only         -c          Only compile\n";
		std::cout << "  --dump-ast             -d          Export abstract syntax tree\n";
		std::cout << "  --dependency           -r          Export module dependency\n";
		std::cout << "  --csym         <FILE>  -g <FILE>   Read cSYM from file\n";
		std::cout << std::endl;
		std::cout << "Interpreter REPL Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --silent               -s          Close the command prompt\n";
		std::cout << "  --args <...>           -a <...>    Set the arguments\n";
		std::cout << std::endl;
		std::cout << "Common Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --no-optimize          -o          Disable optimizer\n";
		std::cout << "  --help                 -h          Show help infomation\n";
		std::cout << "  --version              -v          Show version infomation\n";
		std::cout << "  --wait-before-exit     -w          Wait before process exit\n";
		std::cout << "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n";
		std::cout << "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n";
		std::cout << "  --import-path  <PATH>  -i <PATH>   Set the import path\n";
		std::cout << std::endl;
		return;
	}
	else if (show_version_info) {
		std::cout << "Version: " << cs::current_process->version << std::endl;
		std::cout << cs::copyright_info << std::endl;
		std::cout << "\nMetadata:\n";
		std::cout << "  Import Path: " << cs::current_process->import_path << "\n";
		std::cout << "  STD Version: " << cs::current_process->std_version << "\n";
		std::cout << "  API Version: " << CS_GET_VERSION_STR(COVSCRIPT_API_VERSION) << "\n";
		std::cout << "  ABI Version: " << CS_GET_VERSION_STR(COVSCRIPT_ABI_VERSION) << "\n";
		std::cout << "  Runtime Env: " << COVSCRIPT_PLATFORM_NAME << "\n";
		std::cout << "  Compile Env: " << COVSCRIPT_COMPILER_NAME << "\n";
		std::cout << std::endl;
		return;
	}
	if (!repl && index != args_size) {
		std::string path = cs::process_path(args[index]);
		if (path != "STDIN") {
			if (!cs_impl::file_system::exist(path) || cs_impl::file_system::is_dir(path) ||
			        !cs_impl::file_system::can_read(path))
				throw cs::fatal_error("invalid input file.");
			cs::prepend_import_path(path, cs::current_process);
		}
		cs::array arg;
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		cs::current_process->on_process_exit.add_listener([&context](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
			return true;
		});
		context->compiler->disable_optimizer = no_optimize;
		// Reads cSYM
		if (!csym_path.empty())
			context->compiler->import_csym(path, csym_path);
		try {
			if (path == "STDIN") {
				context->file_path = "STDIN";
				context->instance->compile(std::cin);
			}
			else
				context->instance->compile(path);
			if (dump_ast) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					context->instance->dump_ast(out);
				}
				else
					context->instance->dump_ast(std::cout);
			}
			if (dump_dependency) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					for (auto &it: context->compiler->modules)
						out << it.first << std::endl;
				}
				else {
					for (auto &it: context->compiler->modules)
						std::cout << it.first << std::endl;
				}
			}
			if (!compile_only)
				context->instance->interpret();
		}
		catch (const cs::exception &ce) {
			if (std::strstr(ce.what(), "CS_EXIT") == nullptr) {
				if (context->compiler->csyms.count(ce.file()) > 0) {
					cs::exception ne(ce);
					ne.relocate_to_csym(context->compiler->csyms[ce.file()]);
					throw ne;
				}
				else
					throw;
			}
		}
		catch (...) {
			throw;
		}
	}
	else {
		if (!silent)
			std::cout << "Covariant Script Programming Language Interpreter REPL\nVersion: "
			          << cs::current_process->version << " [" << COVSCRIPT_COMPILER_NAME << " on " << COVSCRIPT_PLATFORM_NAME << "]\n"
			          "Copyright (C) 2017-2025 Michael Lee. All rights reserved.\n"
			          "Please visit <http://covscript.org.cn/> for more information."
			          << std::endl;
		cs::array
		arg{cs::var::make_constant<cs::string>("<REPL_ENV>")};
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		activate_sigint_handler();
		cs::current_process->on_process_exit.add_listener([](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			throw cs::fatal_error("CS_SIGINT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			std::cin.clear();
			return false;
		});
		context->compiler->disable_optimizer = no_optimize;
		cs::repl repl(context);
		std::ofstream log_stream;
		std::string line;
		repl.echo = !silent;
		while (true) {
			try {
#ifdef COVSCRIPT_PLATFORM_WIN32
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				// Workaround: https://stackoverflow.com/a/26763490
				while (true) {
					cs::current_process->poll_event();
					std::getline(std::cin, line);
					if (std::cin)
						break;
				}
#else
				if (!std::cin) {
					int code = 0;
					cs::process_context::on_process_exit_default_handler(&code);
				}
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				std::getline(std::cin, line);
				cs::current_process->poll_event();
#endif
				repl.exec(line);
			}
			catch (const std::exception &e) {
				if (std::strstr(e.what(), "CS_SIGINT") != nullptr) {
					cs::process_context::cleanup_context();
					repl.reset_status();
					activate_sigint_handler();
				}
				else if (std::strstr(e.what(), "CS_EXIT") == nullptr) {
					if (!log_path.empty()) {
						if (!log_stream.is_open())
							log_stream.open(::log_path);
						if (log_stream)
							log_stream << e.what() << std::endl;
						else
							std::cerr << "Write log failed." << std::endl;
					}
					std::cerr << e.what() << std::endl;
				}
				else
					break;
			}
			catch (...) {
				throw;
			}
		}
	}
}